

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshaderdescription.cpp
# Opt level: O0

void deserializeDecorations(QDataStream *stream,int version,InOutVariable *v)

{
  reference piVar1;
  QList<int> *in_RDX;
  int in_ESI;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  int i;
  quint8 b;
  int f;
  QFlags<QShaderDescription::ImageFlag> *in_stack_ffffffffffffffb8;
  QDataStream *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int iVar2;
  QFlag local_14;
  undefined4 local_10;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QDataStream::operator>>(in_RDI,(int *)((long)&in_RDX[1].d.d + 4));
  QDataStream::operator>>(in_RDI,(int *)&in_RDX[1].d.ptr);
  QDataStream::operator>>(in_RDI,(int *)((long)&in_RDX[1].d.ptr + 4));
  local_c = -0x55555556;
  QDataStream::operator>>(in_RDI,&local_c);
  *(int *)&in_RDX[1].d.size = local_c;
  QDataStream::operator>>(in_RDI,&local_c);
  QFlag::QFlag(&local_14,local_c);
  QFlags<QShaderDescription::ImageFlag>::QFlagsStorageHelper
            (in_stack_ffffffffffffffb8,(QFlag)(int)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
  *(undefined4 *)((long)&in_RDX[1].d.size + 4) = local_10;
  if (4 < in_ESI) {
    QDataStream::operator>>(in_RDI,&local_c);
    QList<int>::resize(in_RDX,CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    for (iVar2 = 0; iVar2 < local_c; iVar2 = iVar2 + 1) {
      in_stack_ffffffffffffffc0 = in_RDI;
      piVar1 = QList<int>::operator[]((QList<int> *)in_RDI,(qsizetype)in_stack_ffffffffffffffb8);
      QDataStream::operator>>(in_stack_ffffffffffffffc0,piVar1);
    }
  }
  if (6 < in_ESI) {
    QDataStream::operator>>(in_stack_ffffffffffffffc0,(quint8 *)in_stack_ffffffffffffffb8);
    *(undefined1 *)&in_RDX[3].d.d = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void deserializeDecorations(QDataStream *stream, int version, QShaderDescription::InOutVariable *v)
{
    (*stream) >> v->location;
    (*stream) >> v->binding;
    (*stream) >> v->descriptorSet;
    int f;
    (*stream) >> f;
    v->imageFormat = QShaderDescription::ImageFormat(f);
    (*stream) >> f;
    v->imageFlags = QShaderDescription::ImageFlags(f);

    if (version > QShaderPrivate::QSB_VERSION_WITHOUT_VAR_ARRAYDIMS) {
        (*stream) >> f;
        v->arrayDims.resize(f);
        for (int i = 0; i < f; ++i)
            (*stream) >> v->arrayDims[i];
    }

    if (version > QShaderPrivate::QSB_VERSION_WITHOUT_NATIVE_SHADER_INFO) {
        quint8 b;
        (*stream) >> b;
        v->perPatch = b;
    }
}